

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

void ncnn::get_optimal_tile_mnk
               (int M,int N,int K,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
               int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  int iVar1;
  int *piVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  double dVar3;
  undefined1 auVar4 [16];
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int in_stack_00000020;
  int nn_N;
  int nn_M;
  int nn_K;
  int tile_size;
  size_t l2_cache_size;
  float local_80;
  float local_78;
  int local_74 [3];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54 [3];
  int local_48;
  int local_44;
  int local_40;
  int local_3c [3];
  int local_30;
  int local_2c [3];
  ulong local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_18 = in_R9D;
  local_14 = in_R8D;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  iVar1 = get_cpu_level2_cache_size();
  local_20 = (ulong)iVar1;
  if (in_stack_00000020 == 0) {
    in_stack_00000020 = get_physical_big_cpu_count();
  }
  local_78 = (float)local_20;
  auVar4._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar4._0_4_ = (local_78 / 3.0) / 4.0;
  dVar3 = std::sqrt(auVar4._0_8_);
  local_2c[2] = (int)SUB84(dVar3,0);
  local_2c[1] = 8;
  local_2c[0] = local_2c[2] / 8 << 3;
  piVar2 = std::max<int>(local_2c + 1,local_2c);
  *in_stack_00000008 = *piVar2;
  local_30 = 4;
  local_3c[2] = local_2c[2] / 4 << 2;
  piVar2 = std::max<int>(&local_30,local_3c + 2);
  *in_stack_00000010 = *piVar2;
  local_3c[1] = 8;
  local_3c[0] = local_2c[2] / 8 << 3;
  piVar2 = std::max<int>(local_3c + 1,local_3c);
  *in_stack_00000018 = *piVar2;
  if (0 < local_c) {
    local_40 = (local_c + *in_stack_00000018 + -1) / *in_stack_00000018;
    local_44 = ((local_c + local_40 + -1) / local_40 + 7) / 8 << 3;
    piVar2 = std::min<int>(in_stack_00000018,&local_44);
    *in_stack_00000018 = *piVar2;
    if (local_40 == 1) {
      local_80 = (float)local_20;
      local_2c[2] = (int)(((local_80 / 2.0) / 4.0) / (float)*in_stack_00000018);
      local_48 = 8;
      local_54[2] = local_2c[2] / 8 << 3;
      piVar2 = std::max<int>(&local_48,local_54 + 2);
      *in_stack_00000008 = *piVar2;
      local_54[1] = 4;
      local_54[0] = local_2c[2] / 4 << 2;
      piVar2 = std::max<int>(local_54 + 1,local_54);
      *in_stack_00000010 = *piVar2;
    }
  }
  local_58 = get_physical_cpu_count();
  piVar2 = std::min<int>(&stack0x00000020,&local_58);
  *in_stack_00000008 = *piVar2 * *in_stack_00000008;
  if (0 < local_4) {
    local_5c = (local_4 + *in_stack_00000008 + -1) / *in_stack_00000008;
    local_60 = ((local_4 + local_5c + -1) / local_5c + 7) / 8 << 3;
    piVar2 = std::min<int>(in_stack_00000008,&local_60);
    *in_stack_00000008 = *piVar2;
  }
  if (0 < local_8) {
    local_64 = (local_8 + *in_stack_00000010 + -1) / *in_stack_00000010;
    local_68 = ((local_8 + local_64 + -1) / local_64 + 3) / 4 << 2;
    piVar2 = std::min<int>(in_stack_00000010,&local_68);
    *in_stack_00000010 = *piVar2;
  }
  if (1 < in_stack_00000020) {
    local_74[1] = 1;
    local_74[0] = *in_stack_00000008 / in_stack_00000020;
    piVar2 = std::max<int>(local_74 + 1,local_74);
    local_74[2] = (*piVar2 + 7) / 8 << 3;
    piVar2 = std::min<int>(in_stack_00000008,local_74 + 2);
    *in_stack_00000008 = *piVar2;
  }
  if (0 < local_10) {
    *in_stack_00000008 = (local_10 + 7) / 8 << 3;
  }
  if (0 < local_14) {
    *in_stack_00000010 = (local_14 + 3) / 4 << 2;
  }
  if (0 < local_18) {
    *in_stack_00000018 = (local_18 + 7) / 8 << 3;
  }
  return;
}

Assistant:

static void get_optimal_tile_mnk(int M, int N, int K, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const size_t l2_cache_size = get_cpu_level2_cache_size();

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    int tile_size = (int)sqrt((float)l2_cache_size / 3 / sizeof(float));

#if __AVX512F__
    TILE_M = std::max(16, tile_size / 16 * 16);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
    TILE_M = std::max(8, tile_size / 8 * 8);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
    TILE_M = std::max(4, tile_size / 4 * 4);
    TILE_N = std::max(4, tile_size / 4 * 4);
    TILE_K = std::max(4, tile_size / 4 * 4);
#else
    TILE_M = std::max(2, tile_size / 2 * 2);
    TILE_N = std::max(1, tile_size);
    TILE_K = std::max(2, tile_size / 2 * 2);
#endif

    if (K > 0)
    {
        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif

        if (nn_K == 1)
        {
            tile_size = (int)((float)l2_cache_size / 2 / sizeof(float) / TILE_K);

#if __AVX512F__
            TILE_M = std::max(16, tile_size / 16 * 16);
            TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
            TILE_M = std::max(8, tile_size / 8 * 8);
            TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
            TILE_M = std::max(4, tile_size / 4 * 4);
            TILE_N = std::max(4, tile_size / 4 * 4);
#else
            TILE_M = std::max(2, tile_size / 2 * 2);
            TILE_N = std::max(1, tile_size);
#endif
        }
    }

    TILE_M *= std::min(nT, get_physical_cpu_count());

    if (M > 0)
    {
        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif
    }

    if (N > 0)
    {
        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }

    if (nT > 1)
    {
#if __AVX512F__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
    }

    // always take constant TILE_M/N/K value when provided
    if (constant_TILE_M > 0)
    {
#if __AVX512F__
        TILE_M = (constant_TILE_M + 15) / 16 * 16;
#elif __AVX__
        TILE_M = (constant_TILE_M + 7) / 8 * 8;
#elif __SSE2__
        TILE_M = (constant_TILE_M + 3) / 4 * 4;
#else
        TILE_M = (constant_TILE_M + 1) / 2 * 2;
#endif
    }

    if (constant_TILE_N > 0)
    {
#if __AVX512F__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#elif __AVX__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#elif __SSE2__
        TILE_N = (constant_TILE_N + 3) / 4 * 4;
#else
        TILE_N = constant_TILE_N;
#endif
    }

    if (constant_TILE_K > 0)
    {
#if __AVX512F__
        TILE_K = (constant_TILE_K + 15) / 16 * 16;
#elif __AVX__
        TILE_K = (constant_TILE_K + 7) / 8 * 8;
#elif __SSE2__
        TILE_K = (constant_TILE_K + 3) / 4 * 4;
#else
        TILE_K = (constant_TILE_K + 1) / 2 * 2;
#endif
    }
}